

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack15_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7fff;
  out[1] = *in >> 0xf & 0x7fff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x1fff) << 2 | *puVar1;
  out[3] = *puVar2 >> 0xd & 0x7fff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x7ff) << 4 | *puVar1;
  out[5] = *puVar2 >> 0xb & 0x7fff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[3] & 0x1ff) << 6 | *puVar1;
  out[7] = in[3] >> 9 & 0x7fff;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack15_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;

  return in + 1;
}